

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O1

int use_mirror(obj *obj)

{
  char cVar1;
  permonst *ppVar2;
  boolean bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined8 in_RAX;
  monst *worm;
  long lVar7;
  int tmp;
  byte bVar8;
  int tmp_1;
  char *pcVar9;
  char *line;
  char *pcVar10;
  int iVar11;
  int tmp_2;
  uint uVar12;
  schar dz;
  schar dy;
  undefined8 uStack_38;
  schar dx;
  
  uStack_38 = in_RAX;
  iVar4 = getdir((char *)0x0,&dx,&dy,&dz);
  if (iVar4 == 0) {
    return 0;
  }
  if (((obj->field_0x4a & 1) != 0) && (uVar5 = mt_random(), (uVar5 & 1) == 0)) {
    if ((u.uprops[0x1e].intrinsic != 0) ||
       (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
        (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
      if (ublindf == (obj *)0x0) {
        return 1;
      }
      if (ublindf->oartifact != '\x1d') {
        return 1;
      }
    }
    pcVar9 = "The mirror fogs up and doesn\'t reflect!";
LAB_00146dfd:
    pline(pcVar9);
    return 1;
  }
  if ((dx == '\0' && dy == '\0') && dz == '\0') {
    if ((((u.uprops[0x1e].intrinsic != 0) ||
         (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
          (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
        ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
       (((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
         (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0) &&
        (((u.uprops[0xd].blocked == 0 && (u.uprops[0xc].intrinsic == 0)) &&
         ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0)))))))) {
      pcVar9 = beautiful();
      pcVar10 = body_part(2);
      line = "You can\'t see your %s %s.";
      goto LAB_00146cfc;
    }
    if (u.umonnum == 0x1e) {
      if (u.uprops[0x38].extrinsic == 0) {
        pcVar9 = "Yikes!  You\'ve frozen yourself!";
        if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
          if (u.umonster == 0x1e) {
            pcVar9 = "Yow!  The mirror stares back!";
          }
          else {
            bVar3 = dmgtype(youmonst.data,0x24);
            pcVar9 = "Yikes!  You\'ve frozen yourself!";
            if (bVar3 == '\0') {
              pcVar9 = "Yow!  The mirror stares back!";
            }
          }
        }
        pline(pcVar9);
        lVar7 = (long)u.ulevel;
        uVar5 = mt_random();
        nomul(~SUB164(ZEXT416(uVar5) % SEXT816(0x24 - lVar7),0),"gazing into a mirror");
        return 1;
      }
      pcVar9 = "You stiffen momentarily under your gaze.";
    }
    else {
      if (((youmonst.data)->mlet != '0') && (((youmonst.data)->mflags2 & 0x100) == 0)) {
        if (u.umonnum == 0xe7) {
          pline("Huh?  That doesn\'t look like you!");
          uVar5 = u.uprops[0x1c].intrinsic;
          iVar4 = 3;
          iVar11 = -3;
          do {
            uVar12 = mt_random();
            iVar4 = iVar4 + (uVar12 & 3);
            iVar11 = iVar11 + 1;
          } while (iVar11 != 0);
          make_confused((ulong)(iVar4 + uVar5),'\0');
          return 1;
        }
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
          if (u.uprops[0x1d].intrinsic == 0) {
            if (u.uhs < 3) {
              pcVar9 = beautiful();
              pcVar10 = "You look as %s as ever.";
            }
            else {
              pcVar10 = "You look %s.";
              pcVar9 = "undernourished";
            }
          }
          else {
            pcVar10 = "You look %s.";
            pcVar9 = "peaked";
          }
        }
        else {
          pcVar9 = hcolor((char *)0x0);
          pcVar10 = "You look %s.";
        }
        goto LAB_00146ea5;
      }
      pcVar9 = "You don\'t have a reflection.";
    }
    goto LAB_00146dfd;
  }
  if ((u._1052_1_ & 1) != 0) {
    if ((u.uprops[0x1e].intrinsic != 0) ||
       (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
        (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
      if (ublindf == (obj *)0x0) {
        return 1;
      }
      if (ublindf->oartifact != '\x1d') {
        return 1;
      }
    }
    pcVar9 = mon_nam(u.ustuck);
    pcVar9 = s_suffix(pcVar9);
    pcVar10 = mbodypart(u.ustuck,0x12);
    line = "You reflect %s %s.";
LAB_00146cfc:
    pline(line,pcVar9,pcVar10);
    return 1;
  }
  if ((u._1052_1_ & 2) != 0) {
    pcVar9 = "You reflect the murky water.";
    if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
      if (u.umonnum == u.umonster) {
        pcVar9 = "You give the fish a chance to fix their makeup.";
      }
      else {
        bVar3 = dmgtype(youmonst.data,0x24);
        pcVar9 = "You reflect the murky water.";
        if (bVar3 == '\0') {
          pcVar9 = "You give the fish a chance to fix their makeup.";
        }
      }
    }
    goto LAB_00146dfd;
  }
  if (dz != '\0') {
    if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
       (((youmonst.data)->mflags1 & 0x1000) != 0)) {
      if (ublindf == (obj *)0x0) {
        return 1;
      }
      if (ublindf->oartifact != '\x1d') {
        return 1;
      }
    }
    if (dz < '\x01') {
      pcVar9 = ceiling((int)u.ux,(int)u.uy);
    }
    else {
      pcVar9 = surface((int)u.ux,(int)u.uy);
    }
    pcVar10 = "You reflect the %s.";
LAB_00146ea5:
    pline(pcVar10,pcVar9);
    return 1;
  }
  worm = beam_hit((int)dx,(int)dy,0x50,4,(_func_int_monst_ptr_obj_ptr *)0x0,
                  (_func_int_obj_ptr_obj_ptr *)0x0,obj,(boolean *)0x0);
  if (worm == (monst *)0x0) {
    return 1;
  }
  if ((worm->data->mflags1 & 0x1000) != 0) {
    return 1;
  }
  if (worm->wormno == '\0') {
    if (((viz_array[worm->my][worm->mx] & 2U) == 0) &&
       ((((((u.uprops[0x1e].intrinsic != 0 || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
           || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
          ((bVar8 = 1, ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (bVar8 = 1, ((youmonst.data)->mflags3 & 0x100) == 0)))) ||
        ((bVar8 = 1, (viz_array[worm->my][worm->mx] & 1U) == 0 ||
         ((worm->data->mflags3 & 0x200) == 0)))))) goto LAB_001470a2;
  }
  else {
    bVar3 = worm_known(level,worm);
    if (bVar3 == '\0') {
      bVar8 = 1;
      goto LAB_001470a2;
    }
  }
  uVar5 = *(uint *)&worm->field_0x60;
  if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    bVar8 = 1;
    if ((char)uVar5 < '\0') goto LAB_001470a2;
  }
  else {
    bVar8 = 1;
    if (((char)uVar5 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0)) goto LAB_001470a2;
  }
  bVar8 = (u._1052_1_ & 0x20) >> 5 | (byte)(uVar5 >> 9) & 1;
LAB_001470a2:
  uVar5 = *(uint *)&worm->field_0x60;
  if ((uVar5 >> 0x13 & 1) == 0) {
    if ((uVar5 >> 0x11 & 1) == 0) {
      if (bVar8 != 0) {
        return 1;
      }
      pcVar9 = Monnam(worm);
      pcVar10 = "%s can\'t see anything right now.";
    }
    else {
      ppVar2 = worm->data;
      cVar1 = ppVar2->mlet;
      if ((cVar1 == '0') || ((cVar1 == '6' | (byte)(ppVar2->mflags2 >> 8) & 1) == 1)) {
        if (bVar8 != 0) {
          return 1;
        }
        pcVar9 = Monnam(worm);
        pcVar10 = "%s doesn\'t have a reflection.";
      }
      else {
        if (ppVar2 == mons + 0x127 && (uVar5 & 0x102) == 0) {
          bVar3 = mon_reflects(worm,"The gaze is reflected away by %s %s!");
          if (bVar3 != '\0') {
            return 1;
          }
          if (bVar8 == 0) {
            pcVar9 = Monnam(worm);
            pline("%s is turned to stone!",pcVar9);
          }
          stoned = '\x01';
          killed(worm);
          return 1;
        }
        if (ppVar2 == mons + 0x1e && (uVar5 & 0x102) == 0) {
          uVar12 = (uint)worm->m_lev;
          uVar5 = uVar12;
          if (worm->m_lev != 0) {
            do {
              uVar6 = mt_random();
              uVar12 = uVar12 + uVar6 % 0x23;
              uVar5 = uVar5 - 1;
            } while (uVar5 != 0);
          }
          uVar6 = mt_random();
          uVar5 = 0x78;
          if ((uVar6 & 3) != 0) {
            uVar5 = uVar12;
          }
          if (bVar8 == 0) {
            pcVar9 = Monnam(worm);
            pline("%s is frozen by its reflection.",pcVar9);
          }
          else {
            You_hear("something stop moving.");
          }
          worm->field_0x62 = worm->field_0x62 & 0xfb;
          iVar11 = uVar5 + worm->mfrozen;
          iVar4 = 0x7f;
          if (iVar11 < 0x7f) {
            iVar4 = iVar11;
          }
          worm->mfrozen = (uchar)iVar4;
          return 1;
        }
        if (ppVar2 == mons + 0xe7 && (uVar5 & 0x102) == 0) {
          if (bVar8 == 0) {
            pcVar9 = Monnam(worm);
            pline("%s confuses itself!",pcVar9);
          }
          worm->field_0x62 = worm->field_0x62 | 0x20;
          return 1;
        }
        if (((uVar5 & 0x102) == 0) && (ppVar2 == mons + 0x12f || cVar1 == '\x0e')) {
          if (bVar8 == 0) {
            pcVar9 = Monnam(worm);
            pline("%s admires herself in your mirror.",pcVar9);
            pcVar9 = "She takes it!";
          }
          else {
            pcVar9 = "It steals your mirror!";
          }
          pline(pcVar9);
          setnotworn(obj);
          freeinv(obj);
          mpickobj(worm,obj);
          bVar3 = tele_restrict(worm);
          if (bVar3 != '\0') {
            return 1;
          }
          rloc(level,worm,'\0');
          return 1;
        }
        if (((((cVar1 == '\x15' & (byte)(ppVar2->mflags2 >> 0x1d) & 1) == 0) &&
             ((ppVar2->mflags1 >> 0x11 & 1) == 0)) &&
            (((uVar5 & 2) == 0 || ((ppVar2->mflags1 & 0x1000000) != 0)))) &&
           (uVar5 = mt_random(), 0x33333333 < uVar5 * -0x33333333)) {
          if (bVar8 == 0) {
            pcVar9 = Monnam(worm);
            pline("%s is frightened by its reflection.",pcVar9);
          }
          iVar4 = 2;
          iVar11 = -2;
          do {
            uVar5 = mt_random();
            iVar4 = iVar4 + (uVar5 & 3);
            iVar11 = iVar11 + 1;
          } while (iVar11 != 0);
          monflee(worm,iVar4,'\0','\0');
          return 1;
        }
        if ((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
          if (ublindf == (obj *)0x0) {
            return 1;
          }
          if (ublindf->oartifact != '\x1d') {
            return 1;
          }
        }
        if ((((*(uint *)&worm->field_0x60 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
           ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0)))) {
          return 1;
        }
        if ((((*(uint *)&worm->field_0x60 & 2) == 0) || ((worm->data->mflags1 & 0x1000000) != 0)) &&
           ((worm->data->mflags1 & 0x1000) == 0)) {
          pcVar9 = Monnam(worm);
          iVar4 = pronoun_gender(level,worm);
          pline("%s ignores %s reflection.",pcVar9,genders[iVar4].his);
          return 1;
        }
        pcVar9 = Monnam(worm);
        pcVar10 = "%s doesn\'t seem to notice its reflection.";
      }
    }
  }
  else {
    if (bVar8 != 0) {
      return 1;
    }
    pcVar9 = Monnam(worm);
    pcVar10 = "%s is too tired to look at your mirror.";
  }
  pline(pcVar10,pcVar9);
  return 1;
}

Assistant:

static int use_mirror(struct obj *obj)
{
	struct monst *mtmp;
	char mlet;
	boolean vis;
	schar dx, dy, dz;

	if (!getdir(NULL, &dx, &dy, &dz))
	    return 0;
	
	if (obj->cursed && !rn2(2)) {
		if (!Blind)
			pline("The mirror fogs up and doesn't reflect!");
		return 1;
	}
	if (!dx && !dy && !dz) {
		if (!Blind && !Invisible) {
		    if (u.umonnum == PM_FLOATING_EYE) {
			if (!Free_action) {
			    pline(Hallucination ?
				"Yow!  The mirror stares back!" :
				"Yikes!  You've frozen yourself!");
			    nomul(-rnd((MAXULEV+6) - u.ulevel), "gazing into a mirror");
			} else pline("You stiffen momentarily under your gaze.");
		    } else if (is_vampire(youmonst.data))
			pline("You don't have a reflection.");
		    else if (u.umonnum == PM_UMBER_HULK) {
			pline("Huh?  That doesn't look like you!");
			make_confused(HConfusion + dice(3,4), FALSE);
		    } else if (Hallucination)
			pline(look_str, hcolor(NULL));
		    else if (Sick)
			pline(look_str, "peaked");
		    else if (u.uhs >= WEAK)
			pline(look_str, "undernourished");
		    else pline("You look as %s as ever.", beautiful());
		} else {
			pline("You can't see your %s %s.",
				beautiful(),
				body_part(FACE));
		}
		return 1;
	}
	if (u.uswallow) {
		if (!Blind) pline("You reflect %s %s.", s_suffix(mon_nam(u.ustuck)),
		    mbodypart(u.ustuck, STOMACH));
		return 1;
	}
	if (Underwater) {
		pline(Hallucination ?
		    "You give the fish a chance to fix their makeup." :
		    "You reflect the murky water.");
		return 1;
	}
	if (dz) {
		if (!Blind)
		    pline("You reflect the %s.",
			(dz > 0) ? surface(u.ux,u.uy) : ceiling(u.ux,u.uy));
		return 1;
	}
	mtmp = beam_hit(dx, dy, COLNO, INVIS_BEAM, NULL, NULL, obj, NULL);
	if (!mtmp || !haseyes(mtmp->data))
		return 1;

	vis = canseemon(level, mtmp);
	mlet = mtmp->data->mlet;
	if (mtmp->msleeping) {
		if (vis)
		    pline ("%s is too tired to look at your mirror.",
			    Monnam(mtmp));
	} else if (!mtmp->mcansee) {
	    if (vis)
		pline("%s can't see anything right now.", Monnam(mtmp));
	/* some monsters do special things */
	} else if (is_vampire(mtmp->data) || mlet == S_GHOST) {
	    if (vis)
		pline ("%s doesn't have a reflection.", Monnam(mtmp));
	} else if (!mtmp->mcan && !mtmp->minvis &&
					mtmp->data == &mons[PM_MEDUSA]) {
		if (mon_reflects(mtmp, "The gaze is reflected away by %s %s!"))
			return 1;
		if (vis)
			pline("%s is turned to stone!", Monnam(mtmp));
		stoned = TRUE;
		killed(mtmp);
	} else if (!mtmp->mcan && !mtmp->minvis &&
					mtmp->data == &mons[PM_FLOATING_EYE]) {
		int tmp = dice((int)mtmp->m_lev, (int)mtmp->data->mattk[0].damd);
		if (!rn2(4)) tmp = 120;
		if (vis)
			pline("%s is frozen by its reflection.", Monnam(mtmp));
		else You_hear("something stop moving.");
		mtmp->mcanmove = 0;
		if ( (int) mtmp->mfrozen + tmp > 127)
			mtmp->mfrozen = 127;
		else mtmp->mfrozen += tmp;
	} else if (!mtmp->mcan && !mtmp->minvis &&
					mtmp->data == &mons[PM_UMBER_HULK]) {
		if (vis)
			pline ("%s confuses itself!", Monnam(mtmp));
		mtmp->mconf = 1;
	} else if (!mtmp->mcan && !mtmp->minvis && (mlet == S_NYMPH
				     || mtmp->data==&mons[PM_SUCCUBUS])) {
		if (vis) {
		    pline ("%s admires herself in your mirror.", Monnam(mtmp));
		    pline ("She takes it!");
		} else pline ("It steals your mirror!");
		setnotworn(obj); /* in case mirror was wielded */
		freeinv(obj);
		mpickobj(mtmp,obj);
		if (!tele_restrict(mtmp)) rloc(level, mtmp, FALSE);
	} else if (!is_unicorn(mtmp->data) && !humanoid(mtmp->data) &&
			(!mtmp->minvis || perceives(mtmp->data)) && rn2(5)) {
		if (vis)
		    pline("%s is frightened by its reflection.", Monnam(mtmp));
		monflee(mtmp, dice(2,4), FALSE, FALSE);
	} else if (!Blind) {
		if (mtmp->minvis && !See_invisible)
		    ;
		else if ((mtmp->minvis && !perceives(mtmp->data))
			 || !haseyes(mtmp->data))
		    pline("%s doesn't seem to notice its reflection.",
			Monnam(mtmp));
		else
		    pline("%s ignores %s reflection.",
			  Monnam(mtmp), mhis(level, mtmp));
	}
	return 1;
}